

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  
  mraa_set_log_level(7);
  if (argc == 1) {
    run_interactive_mode();
    return 0;
  }
  iVar1 = process_command(argc,argv);
  return iVar1;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_set_log_level(7);
    if (argc == 1) {
        run_interactive_mode();
        return 0;
    } else
        return process_command(argc, argv);
}